

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3IndexedExprLookup(Parse *pParse,Expr *pExpr,int target)

{
  Vdbe *p;
  bool bVar1;
  int iVar2;
  Op *pOVar3;
  IndexedExpr *pIVar4;
  bool bVar5;
  
  pIVar4 = pParse->pIdxExpr;
  while( true ) {
    if (pIVar4 == (IndexedExpr *)0x0) {
      return -1;
    }
    iVar2 = pIVar4->iDataCur;
    bVar1 = true;
    if ((-1 < iVar2) &&
       (((pParse->iSelfTab == 0 || (bVar5 = iVar2 == pParse->iSelfTab + -1, iVar2 = -1, bVar5)) &&
        (iVar2 = sqlite3ExprCompare((Parse *)0x0,pExpr,pIVar4->pExpr,iVar2), iVar2 == 0)))) {
      p = pParse->pVdbe;
      if (pIVar4->bMaybeNullRow == '\0') {
        sqlite3VdbeAddOp3(p,0x5e,pIVar4->iIdxCur,pIVar4->iIdxCol,target);
      }
      else {
        iVar2 = p->nOp;
        sqlite3VdbeAddOp3(p,0x14,pIVar4->iIdxCur,iVar2 + 3,target);
        sqlite3VdbeAddOp3(p,0x5e,pIVar4->iIdxCur,pIVar4->iIdxCol,target);
        sqlite3VdbeAddOp3(p,9,0,0,0);
        pIVar4 = pParse->pIdxExpr;
        pParse->pIdxExpr = (IndexedExpr *)0x0;
        sqlite3ExprCode(pParse,pExpr,target);
        pParse->pIdxExpr = pIVar4;
        pOVar3 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p->db->mallocFailed == '\0') {
          pOVar3 = p->aOp + (long)iVar2 + 2;
        }
        pOVar3->p2 = p->nOp;
      }
      bVar1 = false;
    }
    if (!bVar1) break;
    pIVar4 = pIVar4->pIENext;
  }
  return target;
}

Assistant:

static SQLITE_NOINLINE int sqlite3IndexedExprLookup(
  Parse *pParse,   /* The parsing context */
  Expr *pExpr,     /* The expression to potentially bypass */
  int target       /* Where to store the result of the expression */
){
  IndexedExpr *p;
  Vdbe *v;
  for(p=pParse->pIdxExpr; p; p=p->pIENext){
    int iDataCur = p->iDataCur;
    if( iDataCur<0 ) continue;
    if( pParse->iSelfTab ){
      if( p->iDataCur!=pParse->iSelfTab-1 ) continue;
      iDataCur = -1;
    }
    if( sqlite3ExprCompare(0, pExpr, p->pExpr, iDataCur)!=0 ) continue;
    v = pParse->pVdbe;
    assert( v!=0 );
    if( p->bMaybeNullRow ){
      /* If the index is on a NULL row due to an outer join, then we
      ** cannot extract the value from the index.  The value must be
      ** computed using the original expression. */
      int addr = sqlite3VdbeCurrentAddr(v);
      sqlite3VdbeAddOp3(v, OP_IfNullRow, p->iIdxCur, addr+3, target);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, p->iIdxCur, p->iIdxCol, target);
      VdbeComment((v, "%s expr-column %d", p->zIdxName, p->iIdxCol));
      sqlite3VdbeGoto(v, 0);
      p = pParse->pIdxExpr;
      pParse->pIdxExpr = 0;
      sqlite3ExprCode(pParse, pExpr, target);
      pParse->pIdxExpr = p;
      sqlite3VdbeJumpHere(v, addr+2);
    }else{
      sqlite3VdbeAddOp3(v, OP_Column, p->iIdxCur, p->iIdxCol, target);
      VdbeComment((v, "%s expr-column %d", p->zIdxName, p->iIdxCol));
    }
    return target;
  }
  return -1;  /* Not found */
}